

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

vector<Tigre::String,_std::allocator<Tigre::String>_> * __thiscall
Tigre::String::explode
          (vector<Tigre::String,_std::allocator<Tigre::String>_> *__return_storage_ptr__,
          String *this,String *delimitador)

{
  ulong uVar1;
  __type _Var2;
  ulong uVar3;
  int local_c4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->super__Vector_base<Tigre::String,_std::allocator<Tigre::String>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Tigre::String,_std::allocator<Tigre::String>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Tigre::String,_std::allocator<Tigre::String>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = 0;
  local_c4 = 0;
  while( true ) {
    uVar1 = (this->value)._M_string_length;
    if ((uVar1 <= uVar3) ||
       (uVar1 <= (ulong)(long)((int)uVar3 + (int)(delimitador->value)._M_string_length + -1)))
    break;
    std::__cxx11::string::substr((ulong)&local_70,(ulong)this);
    String((String *)&local_b0,&local_70);
    _Var2 = std::operator==(&local_b0,&delimitador->value);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_70);
    if (_Var2) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)this);
      String((String *)&local_b0,&local_50);
      std::vector<Tigre::String,_std::allocator<Tigre::String>_>::emplace_back<Tigre::String>
                (__return_storage_ptr__,(String *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_50);
      local_c4 = (int)(delimitador->value)._M_string_length + (int)uVar3;
    }
    uVar3 = uVar3 + 1;
  }
  if ((ulong)(long)local_c4 < uVar1) {
    std::__cxx11::string::substr((ulong)&local_90,(ulong)this);
    String((String *)&local_b0,&local_90);
    std::vector<Tigre::String,_std::allocator<Tigre::String>_>::emplace_back<Tigre::String>
              (__return_storage_ptr__,(String *)&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tigre::String> Tigre::String::explode(String delimitador) {
    std::vector<Tigre::String> result;
    int last_push = 0;

    for (int i=0; i < this->value.size() && i+delimitador.Count()-1 < this->value.size(); i++) {
        if(this->value.substr(i, delimitador.Count()) == delimitador){
            result.push_back(this->value.substr(last_push, i-last_push));
            last_push = i+delimitador.Count();
        }
    }

    if(last_push < this->value.size()){
        result.push_back(this->value.substr(last_push, this->value.size()-last_push));
    }

    return result;
}